

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O0

Expression * __thiscall
slang::ast::builtins::AssertControlTask::bindArgument
          (AssertControlTask *this,size_t argIndex,ASTContext *context,ExpressionSyntax *syntax,
          Args *args)

{
  bool bVar1;
  Expression *pEVar2;
  SyntaxNode *in_RCX;
  SystemSubroutine *in_RDX;
  ulong in_RSI;
  Args *in_RDI;
  ASTContext *in_R8;
  ASTContext *in_stack_000002d0;
  NameSyntax *in_stack_000002d8;
  Compilation *in_stack_000002e0;
  bitmask<slang::ast::LookupFlags> in_stack_000002ec;
  ExpressionSyntax *in_stack_ffffffffffffffc8;
  
  if (((((in_RDI[3]._M_extent._M_extent_value & 1) == 0) || (3 < in_RSI)) &&
      (((in_RDI[3]._M_extent._M_extent_value & 1) != 0 || (in_RSI != 0)))) &&
     (bVar1 = slang::syntax::NameSyntax::isKind(in_RCX->kind), bVar1)) {
    ASTContext::getCompilation((ASTContext *)0x9ad727);
    slang::syntax::SyntaxNode::as<slang::syntax::NameSyntax>(in_RCX);
    bitmask<slang::ast::LookupFlags>::bitmask
              ((bitmask<slang::ast::LookupFlags> *)&stack0xffffffffffffffcc,AlwaysAllowUpward);
    pEVar2 = ArbitrarySymbolExpression::fromSyntax
                       (in_stack_000002e0,in_stack_000002d8,in_stack_000002d0,in_stack_000002ec);
    return pEVar2;
  }
  pEVar2 = SystemSubroutine::bindArgument
                     (in_RDX,(size_t)in_RCX,in_R8,in_stack_ffffffffffffffc8,in_RDI);
  return pEVar2;
}

Assistant:

const Expression& bindArgument(size_t argIndex, const ASTContext& context,
                                   const ExpressionSyntax& syntax, const Args& args) const final {
        if ((isFullMethod && argIndex < 4) || (!isFullMethod && argIndex == 0) ||
            !NameSyntax::isKind(syntax.kind)) {
            return SystemTaskBase::bindArgument(argIndex, context, syntax, args);
        }

        return ArbitrarySymbolExpression::fromSyntax(context.getCompilation(),
                                                     syntax.as<NameSyntax>(), context,
                                                     LookupFlags::AlwaysAllowUpward);
    }